

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O2

void __thiscall Kernel::KBO::State::traverse<_1,true>(State *this,KBO *kbo,AppliedTerm tt)

{
  uint uVar1;
  uint64_t uVar2;
  SubstApplicator *pSVar3;
  State *pSVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  bool bVar7;
  Term *this_00;
  
  if (((undefined1  [24])tt & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
    if (traverse<-1,true>(Kernel::KBO_const&,Kernel::AppliedTerm)::recState == '\0') {
      iVar6 = __cxa_guard_acquire(&traverse<-1,true>(Kernel::KBO_const&,Kernel::AppliedTerm)::
                                   recState);
      if (iVar6 != 0) {
        traverse<-1,_true>::recState._cursor = (State *)0x0;
        traverse<-1,_true>::recState._end = (State *)0x0;
        traverse<-1,_true>::recState._capacity = 0;
        traverse<-1,_true>::recState._stack = (State *)0x0;
        __cxa_atexit(Lib::Stack<State>::~Stack,&traverse<-1,_true>::recState,&__dso_handle);
        __cxa_guard_release(&traverse<-1,true>(Kernel::KBO_const&,Kernel::AppliedTerm)::recState);
      }
    }
    if (traverse<-1,_true>::recState._cursor == traverse<-1,_true>::recState._end) {
      Lib::Stack<State>::expand(&traverse<-1,_true>::recState);
    }
    pSVar4 = traverse<-1,_true>::recState._cursor;
    ((traverse<-1,_true>::recState._cursor)->t).applicator = tt.applicator;
    (pSVar4->t).term._content = tt.term._content;
    (pSVar4->t).aboveVar = tt.aboveVar;
    *(undefined7 *)&(pSVar4->t).field_0x9 = tt._9_7_;
    pSVar4->arg = 0;
    traverse<-1,_true>::recState._cursor = traverse<-1,_true>::recState._cursor + 1;
    while (pSVar4 = traverse<-1,_true>::recState._cursor,
          traverse<-1,_true>::recState._cursor != traverse<-1,_true>::recState._stack) {
      uVar1 = traverse<-1,_true>::recState._cursor[-1].arg;
      uVar2 = traverse<-1,_true>::recState._cursor[-1].t.term._content;
      if (uVar1 < (*(uint *)(uVar2 + 0xc) & 0xfffffff)) {
        traverse<-1,_true>::recState._cursor[-1].arg = uVar1 + 1;
        this_00 = *(Term **)(uVar2 + 0x28 +
                            ((ulong)(*(uint *)(uVar2 + 0xc) & 0xfffffff) - (long)(int)uVar1) * 8);
        bVar7 = pSVar4[-1].t.aboveVar;
        pSVar3 = pSVar4[-1].t.applicator;
        if (((bVar7 & 1U) != 0) && (((ulong)this_00 & 1) != 0)) {
          iVar6 = (*pSVar3->_vptr_SubstApplicator[2])(pSVar3,(ulong)this_00 >> 2 & 0xffffffff);
          this_00 = (Term *)CONCAT44(extraout_var,iVar6);
          bVar7 = false;
        }
        if (((ulong)this_00 & 1) == 0) {
          bVar5 = Term::ground(this_00);
          if (!bVar5) {
            if (traverse<-1,_true>::recState._cursor == traverse<-1,_true>::recState._end) {
              Lib::Stack<State>::expand(&traverse<-1,_true>::recState);
            }
            pSVar4 = traverse<-1,_true>::recState._cursor;
            ((traverse<-1,_true>::recState._cursor)->t).term._content = (uint64_t)this_00;
            (pSVar4->t).aboveVar = bVar7;
            (pSVar4->t).applicator = pSVar3;
            pSVar4->arg = 0;
            traverse<-1,_true>::recState._cursor = traverse<-1,_true>::recState._cursor + 1;
          }
        }
        else {
          recordVariable<_1>(this,(uint)((ulong)this_00 >> 2));
        }
      }
      else {
        traverse<-1,_true>::recState._cursor = traverse<-1,_true>::recState._cursor + -1;
      }
    }
    return;
  }
  recordVariable<_1>(this,(uint)(tt.term._content >> 2));
  return;
}

Assistant:

void KBO::State::traverse(KBO const& kbo, AppliedTerm tt)
{
  static_assert(coef==1 || coef==-1);

  if (tt.term.isVar()) {
    if constexpr (!varsOnly) {
      _weightDiff += kbo._funcWeights._specialWeights._variableWeight * coef;
    }
    recordVariable<coef>(tt.term.var());
    return;
  }
  struct State {
    AppliedTerm t;
    unsigned arg;
  };
  static Stack<State> recState;
  recState.push(State{ tt, 0 });

  if constexpr (!varsOnly) {
    _weightDiff += kbo.symbolWeight(tt.term.term()) * coef;
  }

  while (recState.isNonEmpty()) {
    auto& curr = recState.top();
    if (curr.arg >= curr.t.term.term()->arity()) {
      recState.pop();
      continue;
    }
    AppliedTerm t(*curr.t.term.term()->nthArgument(curr.arg++), curr.t);
    if (t.term.isVar()) {
      ASS(!t.aboveVar);
      if constexpr (!varsOnly) {
        _weightDiff += kbo._funcWeights._specialWeights._variableWeight * coef;
      }
      recordVariable<coef>(t.term.var());
      continue;
    }

    if constexpr (varsOnly) {
      if (!t.term.term()->ground()) {
        recState.push(State{ t, 0 });
      }
    } else {
      _weightDiff += kbo.symbolWeight(t.term.term()) * coef;
      recState.push(State{ t, 0 });
    }
  }
}